

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O0

void __thiscall Console::Console(Console *this)

{
  anon_class_1_0_00000001 local_11;
  Console *local_10;
  Console *this_local;
  
  local_10 = this;
  acto::actor::actor(&this->super_actor);
  (this->super_actor)._vptr_actor = (_func_int **)&PTR__Console_0012a6d0;
  acto::actor::handler<msg_out,Console::Console()::_lambda(acto::actor_ref,msg_out_const&)_1_,void>
            (&this->super_actor,&local_11);
  return;
}

Assistant:

Console() {
    // Метод handler связывает конкретную процедуру с библиотекой
    // для обработки сообщения указанного типа.
    handler< msg_out >( [] (acto::actor_ref, const msg_out& msg)
      { std::cout << msg.text << std::endl; }
    );


    // Во время работы программы можно сменить обработчик просто указав другой метод.
    // Ex:
    //    handler< msg_out >( &Console::another_proc );
    //
    //    handler< msg_out >( [] (acto::actor_ref& sender, const msg_out& msg)
    //        { ; }
    //    );
    // Для того, чтобы отключить обработку указанного сообщения необходимо вызвать
    // метод handler без параметров.
    // Ex:
    //    handler< msg_out >();
    //
    // Метод handler является защищенным методом класса act_o::actor.
    // Это означает, что его невозможно использовать во вне класса-актера.
    // Также это означает, что handler устанавливает обработчики только
    // для объектов данного класса и никакого другого.
  }